

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O3

void __thiscall
duckdb::LogManager::LogManager(LogManager *this,DatabaseInstance *db,LogConfig *config_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  LogMode LVar7;
  InMemoryLogStorage *this_00;
  pointer *__ptr;
  pointer *__ptr_2;
  _Head_base<0UL,_duckdb::InMemoryLogStorage_*,_false> local_28;
  
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal.
  super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal.
  super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  LVar7 = config_p->mode;
  (this->config).enabled = config_p->enabled;
  (this->config).mode = LVar7;
  (this->config).level = config_p->level;
  paVar1 = &(this->config).storage.field_2;
  (this->config).storage._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (config_p->storage)._M_dataplus._M_p;
  paVar2 = &(config_p->storage).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined4 *)((long)&(config_p->storage).field_2 + 4);
    uVar5 = *(undefined4 *)((long)&(config_p->storage).field_2 + 8);
    uVar6 = *(undefined4 *)((long)&(config_p->storage).field_2 + 0xc);
    *(undefined4 *)paVar1 = *(undefined4 *)paVar2;
    *(undefined4 *)((long)&(this->config).storage.field_2 + 4) = uVar4;
    *(undefined4 *)((long)&(this->config).storage.field_2 + 8) = uVar5;
    *(undefined4 *)((long)&(this->config).storage.field_2 + 0xc) = uVar6;
  }
  else {
    (this->config).storage._M_dataplus._M_p = pcVar3;
    (this->config).storage.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->config).storage._M_string_length = (config_p->storage)._M_string_length;
  (config_p->storage)._M_dataplus._M_p = (pointer)paVar2;
  (config_p->storage)._M_string_length = 0;
  (config_p->storage).field_2._M_local_buf[0] = '\0';
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->config).enabled_log_types._M_h,&config_p->enabled_log_types);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->config).disabled_log_types._M_h,&config_p->disabled_log_types,
               &config_p->disabled_log_types);
  (this->log_storage).internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->next_registered_logging_context_index = 0;
  (this->global_logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl = (Logger *)0x0;
  (this->log_storage).internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->registered_log_storages)._M_h._M_buckets =
       &(this->registered_log_storages)._M_h._M_single_bucket;
  (this->registered_log_storages)._M_h._M_bucket_count = 1;
  (this->registered_log_storages)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->registered_log_storages)._M_h._M_element_count = 0;
  (this->registered_log_storages)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->registered_log_storages)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->registered_log_storages)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = (InMemoryLogStorage *)operator_new(0x90);
  InMemoryLogStorage::InMemoryLogStorage(this_00,db);
  local_28._M_head_impl = this_00;
  shared_ptr<duckdb::LogStorage,_true>::
  operator=<duckdb::InMemoryLogStorage,_std::default_delete<duckdb::InMemoryLogStorage>,_true,_0>
            (&this->log_storage,
             (unique_ptr<duckdb::InMemoryLogStorage,_std::default_delete<duckdb::InMemoryLogStorage>,_true>
              *)&local_28);
  if (local_28._M_head_impl != (InMemoryLogStorage *)0x0) {
    (*((local_28._M_head_impl)->super_LogStorage)._vptr_LogStorage[1])();
  }
  return;
}

Assistant:

LogManager::LogManager(DatabaseInstance &db, LogConfig config_p) : config(std::move(config_p)) {
	log_storage = make_uniq<InMemoryLogStorage>(db);
}